

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

sexp sexp_bignum_fxadd(sexp ctx,sexp a,sexp_uint_t b)

{
  ulong uVar1;
  sexp ctx_00;
  sexp dst;
  sexp in_RDX;
  sexp in_RSI;
  sexp_uint_t n;
  sexp_uint_t i;
  sexp_uint_t carry;
  sexp_uint_t *data;
  sexp_uint_t len;
  bool local_41;
  sexp len0;
  sexp local_10;
  
  ctx_00 = (sexp)sexp_bignum_hi(in_RSI);
  dst = (sexp)((long)&in_RSI->value + 0x10);
  len0 = (sexp)0x0;
  do {
    uVar1 = *(ulong *)(&dst->tag + (long)len0 * 2);
    *(long *)(&dst->tag + (long)len0 * 2) =
         (long)&in_RDX->tag + *(long *)(&dst->tag + (long)len0 * 2);
    in_RDX = (sexp)(long)(int)(uint)(-(long)in_RDX - 1U < uVar1);
    len0 = (sexp)((long)&len0->tag + 1);
    local_41 = len0 < ctx_00 && in_RDX != (sexp)0x0;
  } while (local_41);
  local_10 = in_RSI;
  if (in_RDX != (sexp)0x0) {
    local_10 = sexp_copy_bignum(ctx_00,dst,in_RDX,(sexp_uint_t)len0);
    *(undefined8 *)((long)&local_10->value + (long)ctx_00 * 8 + 0x10) = 1;
  }
  return local_10;
}

Assistant:

sexp sexp_bignum_fxadd (sexp ctx, sexp a, sexp_uint_t b) {
  sexp_uint_t len=sexp_bignum_hi(a), *data=sexp_bignum_data(a),
    carry=b, i=0, n;
  do { n = data[i];
       data[i] += carry;
       carry = (n > (SEXP_UINT_T_MAX - carry));
  } while (++i<len && carry);
  if (carry) {
    a = sexp_copy_bignum(ctx, NULL, a, len+1);
    sexp_bignum_data(a)[len] = 1;
  }
  return a;
}